

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

Normalizer2Impl * icu_63::Normalizer2Factory::getNFKCImpl(UErrorCode *errorCode)

{
  Normalizer2Impl *pNVar1;
  
  if (U_ZERO_ERROR < *errorCode) {
    return (Normalizer2Impl *)0x0;
  }
  umtx_initOnce<char_const*>((UInitOnce *)&nfkcInitOnce,initSingletons,"nfkc",errorCode);
  if (nfkcSingleton == (undefined8 *)0x0) {
    pNVar1 = (Normalizer2Impl *)0x0;
  }
  else {
    pNVar1 = (Normalizer2Impl *)*nfkcSingleton;
  }
  return pNVar1;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }